

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

void __thiscall mau::DeliveryCommonData::DeliveryCommonData(DeliveryCommonData *this)

{
  logger::Channel::Channel(&this->Logger,"MauProxy",Trace);
  (this->Socket)._M_t.
  super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  .
  super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
  ._M_head_impl =
       (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0;
  (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BufferAllocator::BufferAllocator(&this->ReadBufferAllocator);
  (this->LastResult)._M_i = Mau_Success;
  LockedValue<MauChannelConfig_t>::LockedValue(&this->ChannelConfig);
  (this->ProxyConfig).Version = 3;
  (this->ProxyConfig).UDPSendBufferSizeBytes = 64000;
  (this->ProxyConfig).UDPRecvBufferSizeBytes = 64000;
  (this->ProxyConfig).UDPListenPort = 0x27d8;
  (this->ProxyConfig).MaxDatagramBytes = 0x5dc;
  (this->ProxyConfig).SendHookContext = (MauAppContextPtr)SUB168(ZEXT816(0) << 0x20,0);
  (this->ProxyConfig).SendHook = (MauSendHookFunction)SUB168(ZEXT816(0) << 0x20,8);
  return;
}

Assistant:

DeliveryCommonData::DeliveryCommonData()
    : Logger("MauProxy", MinimumLogLevel)
{
}